

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O2

void __thiscall TC_parser<true>::nameSpaceInfoValue(TC_parser<true> *this)

{
  char cVar1;
  char *pos;
  float fVar2;
  char *end_read;
  char *local_18;
  
  pos = this->reading_head;
  cVar1 = *pos;
  if ((((cVar1 != '\t') && (cVar1 != ' ')) && (pos != this->endLine)) &&
     ((cVar1 != '\r' && (cVar1 != '|')))) {
    if (cVar1 != ':') {
      parserWarning(this,"malformed example! \'|\',\':\', space, or EOL expected after : \"",
                    this->beginLine,pos,"\"");
      return;
    }
    this->reading_head = pos + 1;
    local_18 = (char *)0x0;
    fVar2 = parseFloat(pos + 1,&local_18,(char *)0x0);
    this->cur_channel_v = fVar2;
    if (local_18 == this->reading_head) {
      parserWarning(this,"malformed example! Float expected after : \"",this->beginLine,
                    this->reading_head,"\"");
      fVar2 = this->cur_channel_v;
    }
    if ((~(uint)fVar2 & 0x7fc00000) == 0) {
      this->cur_channel_v = 1.0;
      parserWarning(this,"warning: invalid namespace value:\"",this->reading_head,local_18,
                    "\" read as NaN. Replacing with 1.");
    }
    this->reading_head = local_18;
  }
  return;
}

Assistant:

inline void nameSpaceInfoValue()
  {
    if (*reading_head == ' ' || *reading_head == '\t' || reading_head == endLine || *reading_head == '|' ||
        *reading_head == '\r')
    {
      // nameSpaceInfoValue -->  ø
    }
    else if (*reading_head == ':')
    {
      // nameSpaceInfoValue --> ':' 'Float'
      ++reading_head;
      char* end_read = nullptr;
      cur_channel_v = parseFloat(reading_head, &end_read);
      if (end_read == reading_head)
      {
        parserWarning("malformed example! Float expected after : \"", beginLine, reading_head, "\"");
      }
      if (nanpattern(cur_channel_v))
      {
        cur_channel_v = 1.f;
        parserWarning(
            "warning: invalid namespace value:\"", reading_head, end_read, "\" read as NaN. Replacing with 1.");
      }
      reading_head = end_read;
    }
    else
    {
      // syntax error
      parserWarning("malformed example! '|',':', space, or EOL expected after : \"", beginLine, reading_head, "\"");
    }
  }